

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode multi_socket(Curl_multi *multi,_Bool checkall,curl_socket_t s,int ev_bitmask,
                      int *running_handles)

{
  bool bVar1;
  CURLMcode CVar2;
  CURLMcode CVar3;
  Curl_sh_entry *hash;
  Curl_hash_element *pCVar4;
  Curl_tree *pCVar5;
  uint uVar6;
  undefined7 in_register_00000031;
  uint uVar7;
  uint uVar8;
  Curl_easy **ppCVar9;
  Curl_easy *pCVar10;
  curltime cVar11;
  curltime now;
  curltime local_f0;
  Curl_tree *t;
  uint *local_d8;
  sigpipe_ignore pipe_st;
  
  cVar11 = Curl_now();
  local_f0.tv_sec = cVar11.tv_sec;
  local_f0.tv_usec = cVar11.tv_usec;
  if ((int)CONCAT71(in_register_00000031,checkall) == 0) {
    if (s == -1) {
      (multi->timer_lastcall).tv_sec = 0;
      *(undefined8 *)&(multi->timer_lastcall).tv_usec = 0;
    }
    else {
      hash = sh_getentry(&multi->sockhash,s);
      if (hash != (Curl_sh_entry *)0x0) {
        Curl_hash_start_iterate(&hash->transfers,(Curl_hash_iterator *)&pipe_st);
        pCVar4 = Curl_hash_next_element((Curl_hash_iterator *)&pipe_st);
        while (pCVar4 != (Curl_hash_element *)0x0) {
          pCVar10 = (Curl_easy *)pCVar4->ptr;
          if ((pCVar10->conn != (connectdata *)0x0) && ((pCVar10->conn->handler->flags & 8) == 0)) {
            (pCVar10->state).select_bits = (uchar)ev_bitmask;
          }
          Curl_expire(pCVar10,0,EXPIRE_RUN_NOW);
          pCVar4 = Curl_hash_next_element((Curl_hash_iterator *)&pipe_st);
        }
        cVar11 = Curl_now();
        local_f0.tv_sec = cVar11.tv_sec;
        local_f0.tv_usec = cVar11.tv_usec;
      }
    }
    bVar1 = false;
    pCVar10 = (Curl_easy *)0x0;
    CVar2 = CURLM_OK;
    uVar7 = 0;
    local_d8 = (uint *)running_handles;
    do {
      uVar8 = uVar7;
      CVar3 = CVar2;
      if (pCVar10 != (Curl_easy *)0x0) {
        uVar8 = *(uint *)&(pCVar10->set).field_0x8be;
        if (bVar1) {
          uVar6 = uVar8 & 1;
          uVar8 = uVar7;
          if (uVar6 != ((byte)uVar7 & 1)) {
            sigpipe_restore(&pipe_st);
            sigpipe_ignore(pCVar10,&pipe_st);
            uVar8 = (uint)(byte)(pCVar10->set).field_0x8be;
          }
        }
        else {
          sigpipe_ignore(pCVar10,&pipe_st);
          bVar1 = true;
        }
        CVar3 = multi_runsingle(multi,&local_f0,pCVar10);
        if (CVar3 < CURLM_BAD_HANDLE) {
          CVar2 = singlesocket(multi,pCVar10);
          CVar3 = CURLM_OK;
          if (CVar2 != CURLM_OK) break;
        }
      }
      CVar2 = CVar3;
      cVar11.tv_usec = local_f0.tv_usec;
      cVar11.tv_sec = local_f0.tv_sec;
      cVar11._12_4_ = 0;
      pCVar5 = Curl_splaygetbest(cVar11,multi->timetree,&t);
      multi->timetree = pCVar5;
      if (t == (Curl_tree *)0x0) break;
      pCVar10 = (Curl_easy *)t->payload;
      now.tv_usec = local_f0.tv_usec;
      now.tv_sec = local_f0.tv_sec;
      now._12_4_ = 0;
      add_next_timeout(now,multi,pCVar10);
      uVar7 = uVar8;
    } while (t != (Curl_tree *)0x0);
    if (bVar1) {
      sigpipe_restore(&pipe_st);
    }
    *local_d8 = multi->num_alive;
  }
  else {
    CVar2 = curl_multi_perform(multi,running_handles);
    if (CVar2 == CURLM_BAD_HANDLE) {
      CVar2 = CURLM_BAD_HANDLE;
    }
    else {
      ppCVar9 = &multi->easyp;
      while ((CVar2 == CURLM_OK && (pCVar10 = *ppCVar9, pCVar10 != (Curl_easy *)0x0))) {
        CVar2 = singlesocket(multi,pCVar10);
        ppCVar9 = &pCVar10->next;
      }
    }
  }
  return CVar2;
}

Assistant:

static CURLMcode multi_socket(struct Curl_multi *multi,
                              bool checkall,
                              curl_socket_t s,
                              int ev_bitmask,
                              int *running_handles)
{
  CURLMcode result = CURLM_OK;
  struct Curl_easy *data = NULL;
  struct Curl_tree *t;
  struct curltime now = Curl_now();
  bool first = FALSE;
  bool nosig = FALSE;
  SIGPIPE_VARIABLE(pipe_st);

  if(checkall) {
    /* *perform() deals with running_handles on its own */
    result = curl_multi_perform(multi, running_handles);

    /* walk through each easy handle and do the socket state change magic
       and callbacks */
    if(result != CURLM_BAD_HANDLE) {
      data = multi->easyp;
      while(data && !result) {
        result = singlesocket(multi, data);
        data = data->next;
      }
    }

    /* or should we fall-through and do the timer-based stuff? */
    return result;
  }
  if(s != CURL_SOCKET_TIMEOUT) {
    struct Curl_sh_entry *entry = sh_getentry(&multi->sockhash, s);

    if(!entry)
      /* Unmatched socket, we can't act on it but we ignore this fact.  In
         real-world tests it has been proved that libevent can in fact give
         the application actions even though the socket was just previously
         asked to get removed, so thus we better survive stray socket actions
         and just move on. */
      ;
    else {
      struct Curl_hash_iterator iter;
      struct Curl_hash_element *he;

      /* the socket can be shared by many transfers, iterate */
      Curl_hash_start_iterate(&entry->transfers, &iter);
      for(he = Curl_hash_next_element(&iter); he;
          he = Curl_hash_next_element(&iter)) {
        data = (struct Curl_easy *)he->ptr;
        DEBUGASSERT(data);
        DEBUGASSERT(data->magic == CURLEASY_MAGIC_NUMBER);

        if(data->conn && !(data->conn->handler->flags & PROTOPT_DIRLOCK))
          /* set socket event bitmask if they're not locked */
          data->state.select_bits = (unsigned char)ev_bitmask;

        Curl_expire(data, 0, EXPIRE_RUN_NOW);
      }

      /* Now we fall-through and do the timer-based stuff, since we don't want
         to force the user to have to deal with timeouts as long as at least
         one connection in fact has traffic. */

      data = NULL; /* set data to NULL again to avoid calling
                      multi_runsingle() in case there's no need to */
      now = Curl_now(); /* get a newer time since the multi_runsingle() loop
                           may have taken some time */
    }
  }
  else {
    /* Asked to run due to time-out. Clear the 'lastcall' variable to force
       Curl_update_timer() to trigger a callback to the app again even if the
       same timeout is still the one to run after this call. That handles the
       case when the application asks libcurl to run the timeout
       prematurely. */
    memset(&multi->timer_lastcall, 0, sizeof(multi->timer_lastcall));
  }

  /*
   * The loop following here will go on as long as there are expire-times left
   * to process in the splay and 'data' will be re-assigned for every expired
   * handle we deal with.
   */
  do {
    /* the first loop lap 'data' can be NULL */
    if(data) {
      if(!first) {
        first = TRUE;
        nosig = data->set.no_signal; /* initial state */
        sigpipe_ignore(data, &pipe_st);
      }
      else if(data->set.no_signal != nosig) {
        sigpipe_restore(&pipe_st);
        sigpipe_ignore(data, &pipe_st);
        nosig = data->set.no_signal; /* remember new state */
      }
      result = multi_runsingle(multi, &now, data);

      if(CURLM_OK >= result) {
        /* get the socket(s) and check if the state has been changed since
           last */
        result = singlesocket(multi, data);
        if(result)
          break;
      }
    }

    /* Check if there's one (more) expired timer to deal with! This function
       extracts a matching node if there is one */

    multi->timetree = Curl_splaygetbest(now, multi->timetree, &t);
    if(t) {
      data = t->payload; /* assign this for next loop */
      (void)add_next_timeout(now, multi, t->payload);
    }

  } while(t);
  if(first)
    sigpipe_restore(&pipe_st);

  *running_handles = multi->num_alive;
  return result;
}